

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O2

void __thiscall
duckdb::FlushMoveState::FlushMoveState(FlushMoveState *this,TupleDataCollection *collection_p)

{
  TupleDataScanState *this_00;
  TupleDataCollection *this_01;
  TupleDataLayout *pTVar1;
  ulong local_b0;
  Vector *local_a8;
  Vector *local_a0;
  vector<unsigned_long,_true> column_ids;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  this->collection = collection_p;
  this_00 = &this->scan_state;
  TupleDataScanState::TupleDataScanState(this_00);
  DataChunk::DataChunk(&this->groups);
  LogicalType::LogicalType(&local_48,UBIGINT);
  Vector::Vector(&this->hashes,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  local_a0 = &this->hashes;
  LogicalType::LogicalType(&local_60,POINTER);
  local_a8 = &this->group_addresses;
  Vector::Vector(local_a8,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  SelectionVector::SelectionVector(&this->new_groups_sel,0x800);
  pTVar1 = TupleDataCollection::GetLayout(this->collection);
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids,
             ((long)(pTVar1->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar1->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1);
  for (local_b0 = 0;
      local_b0 <
      ((long)(pTVar1->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(pTVar1->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 - 1U; local_b0 = local_b0 + 1) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&column_ids,&local_b0);
  }
  this_01 = this->collection;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             &column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  TupleDataCollection::InitializeScan
            (this_01,this_00,(vector<unsigned_long,_true> *)&local_78,DESTROY_AFTER_DONE);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  TupleDataCollection::InitializeScanChunk(this->collection,this_00,&this->groups);
  this->hash_col_idx =
       ((long)(pTVar1->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)(pTVar1->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x18 - 1;
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&column_ids);
  return;
}

Assistant:

explicit FlushMoveState(TupleDataCollection &collection_p)
	    : collection(collection_p), hashes(LogicalType::HASH), group_addresses(LogicalType::POINTER),
	      new_groups_sel(STANDARD_VECTOR_SIZE) {
		const auto &layout = collection.GetLayout();
		vector<column_t> column_ids;
		column_ids.reserve(layout.ColumnCount() - 1);
		for (idx_t col_idx = 0; col_idx < layout.ColumnCount() - 1; col_idx++) {
			column_ids.emplace_back(col_idx);
		}
		collection.InitializeScan(scan_state, column_ids, TupleDataPinProperties::DESTROY_AFTER_DONE);
		collection.InitializeScanChunk(scan_state, groups);
		hash_col_idx = layout.ColumnCount() - 1;
	}